

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int lyp_ctx_check_module(lys_module *module)

{
  byte bVar1;
  ly_ctx *ctx;
  lys_module *plVar2;
  lys_revision *__s2;
  bool bVar3;
  int iVar4;
  int iVar5;
  lys_revision *plVar6;
  int iVar7;
  uint uVar8;
  char *format;
  lys_revision *plVar9;
  lys_revision *__s1;
  long lVar10;
  lys_revision *__s2_00;
  bool bVar11;
  
  if (module == (lys_module *)0x0) {
    __assert_fail("module",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                  ,0xdd1,"int lyp_ctx_check_module(struct lys_module *)");
  }
  ctx = module->ctx;
  bVar1 = module->rev_size;
  __s2_00 = (lys_revision *)0x0;
  for (lVar10 = 0; (ulong)bVar1 * 0x28 - lVar10 != 0; lVar10 = lVar10 + 0x28) {
    plVar6 = module->rev;
    if ((__s2_00 == (lys_revision *)0x0) ||
       (iVar4 = strcmp(__s2_00->date,plVar6->date + lVar10), iVar4 < 0)) {
      __s2_00 = (lys_revision *)(plVar6->date + lVar10);
    }
  }
  plVar6 = (lys_revision *)"<latest>";
  if (__s2_00 != (lys_revision *)0x0) {
    plVar6 = __s2_00;
  }
  iVar4 = -1;
  iVar7 = 0;
  bVar3 = false;
  do {
    if ((ctx->models).used <= iVar7) {
      if (bVar3) {
        iVar4 = lys_set_implemented((ctx->models).list[iVar4]);
        uVar8 = -(uint)(iVar4 != 0) | 1;
      }
      else {
        uVar8 = 0;
      }
      return uVar8;
    }
    plVar2 = (ctx->models).list[iVar7];
    plVar9 = (lys_revision *)plVar2->name;
    __s2 = (lys_revision *)module->name;
    iVar5 = strcmp((char *)plVar9,(char *)__s2);
    if (iVar5 == 0) {
      plVar9 = __s2;
      if (bVar3) {
        bVar3 = true;
        bVar11 = iVar7 != iVar4;
        iVar4 = iVar7;
        if (bVar11) {
LAB_00127b8b:
          format = "Module \"%s@%s\" in another revision \"%s\" already implemented.";
          __s1 = plVar6;
LAB_00127bc0:
          ly_log(ctx,LY_LLERR,LY_EINVAL,format,plVar9,__s1);
          return -1;
        }
      }
      else {
        if (plVar2->rev_size == '\0') {
          if (module->rev_size != '\0') {
            ly_log(ctx,LY_LLERR,LY_EINVAL,"Module \"%s\" without revision already in context.",__s2)
            ;
            return -1;
          }
        }
        else {
          __s1 = plVar2->rev;
          if (module->rev_size == '\0') {
            format = "Module \"%s\" with revision \"%s\" already in context.";
            goto LAB_00127bc0;
          }
          iVar5 = strcmp(__s1->date,__s2_00->date);
          if (iVar5 != 0) {
            bVar3 = false;
            if (((module->field_0x40 & 0x80) != 0) && ((plVar2->field_0x40 & 0x80) != 0))
            goto LAB_00127b8b;
            goto LAB_00127b30;
          }
        }
        ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Module \"%s@%s\" already in context.",__s2,plVar6)
        ;
        plVar2 = (ctx->models).list[iVar7];
        if ((plVar2->field_0x40 & 0x40) != 0) {
          lys_set_enabled(plVar2);
        }
        if ((module->field_0x40 & 0x80) == 0) {
          return 1;
        }
        lVar10 = (long)iVar7;
        bVar3 = true;
        iVar4 = iVar7;
        iVar7 = -1;
        if (((ctx->models).list[lVar10]->field_0x40 & 0x80) != 0) {
          return 1;
        }
      }
    }
    else {
      iVar5 = strcmp(plVar2->ns,module->ns);
      if (iVar5 == 0) {
        format = "Two different modules (\"%s\" and \"%s\") have the same namespace \"%s\".";
        __s1 = __s2;
        goto LAB_00127bc0;
      }
    }
LAB_00127b30:
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

int
lyp_ctx_check_module(struct lys_module *module)
{
    struct ly_ctx *ctx;
    int i, match_i = -1, to_implement;
    const char *last_rev = NULL;

    assert(module);
    to_implement = 0;
    ctx = module->ctx;

    /* find latest revision */
    for (i = 0; i < module->rev_size; ++i) {
        if (!last_rev || (strcmp(last_rev, module->rev[i].date) < 0)) {
            last_rev = module->rev[i].date;
        }
    }

    for (i = 0; i < ctx->models.used; i++) {
        /* check name (name/revision) and namespace uniqueness */
        if (!strcmp(ctx->models.list[i]->name, module->name)) {
            if (to_implement) {
                if (i == match_i) {
                    continue;
                }
                LOGERR(ctx, LY_EINVAL, "Module \"%s@%s\" in another revision \"%s\" already implemented.",
                       module->name, last_rev ? last_rev : "<latest>", ctx->models.list[i]->rev[0].date);
                return -1;
            } else if (!ctx->models.list[i]->rev_size && module->rev_size) {
                LOGERR(ctx, LY_EINVAL, "Module \"%s\" without revision already in context.", module->name);
                return -1;
            } else if (ctx->models.list[i]->rev_size && !module->rev_size) {
                LOGERR(ctx, LY_EINVAL, "Module \"%s\" with revision \"%s\" already in context.",
                       module->name, ctx->models.list[i]->rev[0].date);
                return -1;
            } else if ((!module->rev_size && !ctx->models.list[i]->rev_size)
                    || !strcmp(ctx->models.list[i]->rev[0].date, last_rev)) {

                LOGVRB("Module \"%s@%s\" already in context.", module->name, last_rev ? last_rev : "<latest>");

                /* if disabled, enable first */
                if (ctx->models.list[i]->disabled) {
                    lys_set_enabled(ctx->models.list[i]);
                }

                to_implement = module->implemented;
                match_i = i;
                if (to_implement && !ctx->models.list[i]->implemented) {
                    /* check first that it is okay to change it to implemented */
                    i = -1;
                    continue;
                }
                return 1;

            } else if (module->implemented && ctx->models.list[i]->implemented) {
                LOGERR(ctx, LY_EINVAL, "Module \"%s@%s\" in another revision \"%s\" already implemented.",
                       module->name, last_rev ? last_rev : "<latest>", ctx->models.list[i]->rev[0].date);
                return -1;
            }
            /* else keep searching, for now the caller is just adding
             * another revision of an already present schema
             */
        } else if (!strcmp(ctx->models.list[i]->ns, module->ns)) {
            LOGERR(ctx, LY_EINVAL, "Two different modules (\"%s\" and \"%s\") have the same namespace \"%s\".",
                   ctx->models.list[i]->name, module->name, module->ns);
            return -1;
        }
    }

    if (to_implement) {
        if (lys_set_implemented(ctx->models.list[match_i])) {
            return -1;
        }
        return 1;
    }

    return 0;
}